

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O0

ssize_t compress_filter_read(archive_read_filter *self,void **pblock)

{
  long lVar1;
  archive_read_filter *paVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long *in_RSI;
  long in_RDI;
  bool bVar6;
  int ret;
  uchar *end;
  uchar *start;
  uchar *p;
  private_data *state;
  archive_read_filter *self_00;
  long local_8;
  
  lVar1 = *(long *)(in_RDI + 0x50);
  if (*(int *)(lVar1 + 0x3c) == 0) {
    paVar2 = *(archive_read_filter **)(lVar1 + 0x30);
    lVar3 = *(long *)(lVar1 + 0x28);
    self_00 = paVar2;
    do {
      while( true ) {
        while( true ) {
          bVar6 = false;
          if (self_00 < (archive_read_filter *)((long)&paVar2->position + lVar3)) {
            bVar6 = *(int *)(lVar1 + 0x3c) == 0;
          }
          if (!bVar6) {
            *in_RSI = (long)paVar2;
            return (long)self_00 - (long)paVar2;
          }
          if (*(ulong *)(lVar1 + 0x30060) <= lVar1 + 0x30068U) break;
          lVar4 = *(long *)(lVar1 + 0x30060);
          *(long *)(lVar1 + 0x30060) = lVar4 + -1;
          *(undefined1 *)&self_00->position = *(undefined1 *)(lVar4 + -1);
          self_00 = (archive_read_filter *)((long)&self_00->position + 1);
        }
        iVar5 = next_code(self_00);
        if (iVar5 != -1) break;
        *(undefined4 *)(lVar1 + 0x3c) = 0xffffffff;
      }
    } while (iVar5 == 0);
    local_8 = (long)iVar5;
  }
  else {
    *in_RSI = 0;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static ssize_t
compress_filter_read(struct archive_read_filter *self, const void **pblock)
{
	struct private_data *state;
	unsigned char *p, *start, *end;
	int ret;

	state = (struct private_data *)self->data;
	if (state->end_of_stream) {
		*pblock = NULL;
		return (0);
	}
	p = start = (unsigned char *)state->out_block;
	end = start + state->out_block_size;

	while (p < end && !state->end_of_stream) {
		if (state->stackp > state->stack) {
			*p++ = *--state->stackp;
		} else {
			ret = next_code(self);
			if (ret == -1)
				state->end_of_stream = ret;
			else if (ret != ARCHIVE_OK)
				return (ret);
		}
	}

	*pblock = start;
	return (p - start);
}